

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

int testing::internal::GetParamIndex(char **param_names,string *param_name)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar2 = std::__cxx11::string::compare((char *)param_name);
  if (iVar2 == 0) {
    iVar2 = -1;
  }
  else {
    iVar2 = -3;
    if (*param_names != (char *)0x0) {
      lVar4 = 0;
      do {
        iVar3 = std::__cxx11::string::compare((char *)param_name);
        if (iVar3 == 0) {
          return (int)lVar4;
        }
        lVar1 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while (param_names[lVar1] != (char *)0x0);
    }
  }
  return iVar2;
}

Assistant:

int GetParamIndex(const char* param_names[], const string& param_name) {
  if (param_name == "*")
    return kTupleInterpolation;

  for (int i = 0; param_names[i] != NULL; i++) {
    if (param_name == param_names[i])
      return i;
  }
  return kInvalidInterpolation;
}